

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_iface_ips.c
# Opt level: O3

char * ares_os_if_indextoname(uint index,char *name,size_t name_len)

{
  char *pcVar1;
  
  if (name_len < 0x10) {
    return (char *)0x0;
  }
  pcVar1 = if_indextoname(index,name);
  return pcVar1;
}

Assistant:

const char *ares_os_if_indextoname(unsigned int index, char *name, size_t name_len)
{
#ifdef HAVE_IF_INDEXTONAME
  if (name_len < IF_NAMESIZE) {
    return NULL;
  }
  return if_indextoname(index, name);
#else
  ares_status_t     status;
  ares_iface_ips_t *ips = NULL;
  size_t            i;
  const char       *ptr = NULL;

  if (name == NULL || name_len < IF_NAMESIZE) {
    goto done;
  }

  if (index == 0) {
    goto done;
  }

  status =
    ares_iface_ips(&ips, ARES_IFACE_IP_V6 | ARES_IFACE_IP_LINKLOCAL, NULL);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  for (i = 0; i < ares_iface_ips_cnt(ips); i++) {
    if (ares_iface_ips_get_flags(ips, i) & ARES_IFACE_IP_LINKLOCAL &&
        ares_iface_ips_get_ll_scope(ips, i) == index) {
      ares_strcpy(name, ares_iface_ips_get_name(ips, i), name_len);
      ptr = name;
      goto done;
    }
  }

done:
  ares_iface_ips_destroy(ips);
  return ptr;
#endif
}